

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-list.c
# Opt level: O3

void monster_list_collect(monster_list_t *list)

{
  loc grid1;
  loc grid2;
  size_t sVar1;
  player *ppVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint uVar5;
  wchar_t wVar6;
  monster *mon;
  ulong uVar7;
  uint16_t *puVar8;
  
  if (((list != (monster_list_t *)0x0) && (list->entries != (monster_list_entry_t *)0x0)) &&
     (sVar1 = list->entries_size, wVar4 = cave_monster_max(cave), wVar4 <= (wchar_t)sVar1)) {
    wVar4 = cave_monster_max(cave);
    if (L'\x01' < wVar4) {
      wVar4 = L'\x01';
      do {
        mon = cave_monster(cave,wVar4);
        _Var3 = monster_is_visible(mon);
        if (((_Var3) && (_Var3 = monster_is_camouflaged(mon), !_Var3)) &&
           (uVar5 = (uint)list->entries_size, 0 < (int)uVar5)) {
          uVar7 = (ulong)(uVar5 & 0x7fffffff);
          puVar8 = list->entries->asleep;
          do {
            if (((monster_list_entry_t *)(puVar8 + -6))->race == (monster_race *)0x0) {
              *(undefined8 *)(puVar8 + 2) = 0;
              *(undefined8 *)(puVar8 + 6) = 0;
              ((monster_list_entry_t *)(puVar8 + -6))->race = (monster_race *)0x0;
              *(undefined8 *)(puVar8 + -2) = 0;
              ((monster_list_entry_t *)(puVar8 + -6))->race = mon->race;
LAB_0016cdbe:
              *(uint8_t *)(puVar8 + 6) = mon->attr;
              grid1.x = (player->grid).x;
              grid1.y = (player->grid).y;
              grid2.x = (mon->grid).x;
              grid2.y = (mon->grid).y;
              _Var3 = projectable((chunk *)cave,grid1,grid2,L'\0');
              uVar7 = (ulong)!_Var3;
              puVar8[uVar7 - 2] = puVar8[uVar7 - 2] + 1;
              if (0 < mon->m_timed[0]) {
                puVar8[uVar7] = puVar8[uVar7] + 1;
              }
              ppVar2 = player;
              puVar8[uVar7 + 2] = (short)(mon->grid).x - (short)(player->grid).x;
              puVar8[uVar7 + 4] = (short)(mon->grid).y - (short)(ppVar2->grid).y;
              break;
            }
            if (((monster_list_entry_t *)(puVar8 + -6))->race == mon->race) goto LAB_0016cdbe;
            puVar8 = puVar8 + 0x10;
            uVar7 = uVar7 - 1;
          } while (uVar7 != 0);
        }
        wVar4 = wVar4 + L'\x01';
        wVar6 = cave_monster_max(cave);
      } while (wVar4 < wVar6);
    }
    uVar5 = (uint)list->entries_size;
    if (0 < (int)uVar5) {
      uVar7 = (ulong)(uVar5 & 0x7fffffff);
      puVar8 = list->entries->count + 1;
      do {
        if (((monster_list_entry_t *)(puVar8 + -5))->race != (monster_race *)0x0) {
          if (puVar8[-1] != 0) {
            list->total_entries[0] = list->total_entries[0] + 1;
          }
          if (*puVar8 != 0) {
            list->total_entries[1] = list->total_entries[1] + 1;
          }
          list->total_monsters[0] = list->total_monsters[0] + puVar8[-1];
          list->total_monsters[1] = list->total_monsters[1] + *puVar8;
          list->distinct_entries = list->distinct_entries + 1;
        }
        puVar8 = puVar8 + 0x10;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    list->creation_turn = turn;
    list->sorted = false;
  }
  return;
}

Assistant:

void monster_list_collect(monster_list_t *list)
{
	int i;

	if (list == NULL || list->entries == NULL)
		return;

	if (!monster_list_can_update(list))
		return;

	/* Use cave_monster_max() here in case the monster list isn't compacted. */
	for (i = 1; i < cave_monster_max(cave); i++) {
		struct monster *mon = cave_monster(cave, i);
		monster_list_entry_t *entry = NULL;
		int j, field;
		bool los = false;

		/* Only consider visible, known monsters */
		if (!monster_is_visible(mon) ||	monster_is_camouflaged(mon))
			continue;

		/* Find or add a list entry. */
		for (j = 0; j < (int)list->entries_size; j++) {
			if (list->entries[j].race == NULL) {
				/* We found an empty slot, so add this race here. */
				entry = &list->entries[j];
				memset(entry, 0, sizeof(monster_list_entry_t));
				entry->race = mon->race;
				break;
			}
			else if (list->entries[j].race == mon->race) {
				/* We found a matching race and we'll use that. */
				entry = &list->entries[j];
				break;
			}
		}

		if (entry == NULL)
			continue;

		/* Always collect the latest monster attribute so that flicker
		 * animation works. If this is 0, it needs to be replaced by 
		 * the standard glyph in the UI */
		entry->attr = mon->attr;

		/*
		 * Check for LOS
		 * Hack - we should use (mon->mflag & (MFLAG_VIEW)) here,
		 * but this does not catch monsters detected by ESP which are
		 * targetable, so we cheat and use projectable() instead
		 */
		los = projectable(cave, player->grid, mon->grid, PROJECT_NONE);
		field = (los) ? MONSTER_LIST_SECTION_LOS : MONSTER_LIST_SECTION_ESP;
		entry->count[field]++;

		if (mon->m_timed[MON_TMD_SLEEP] > 0)
			entry->asleep[field]++;

		/* Store the location offset from the player; this is only used for
		 * monster counts of 1 */
		entry->dx[field] = mon->grid.x - player->grid.x;
		entry->dy[field] = mon->grid.y - player->grid.y;
	}

	/* Collect totals for easier calculations of the list. */
	for (i = 0; i < (int)list->entries_size; i++) {
		if (list->entries[i].race == NULL)
			continue;

		if (list->entries[i].count[MONSTER_LIST_SECTION_LOS] > 0)
			list->total_entries[MONSTER_LIST_SECTION_LOS]++;

		if (list->entries[i].count[MONSTER_LIST_SECTION_ESP] > 0)
			list->total_entries[MONSTER_LIST_SECTION_ESP]++;

		list->total_monsters[MONSTER_LIST_SECTION_LOS] +=
			list->entries[i].count[MONSTER_LIST_SECTION_LOS];
		list->total_monsters[MONSTER_LIST_SECTION_ESP] +=
			list->entries[i].count[MONSTER_LIST_SECTION_ESP];
		list->distinct_entries++;
	}

	list->creation_turn = turn;
	list->sorted = false;
}